

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportBuildFileGenerator::GenerateImportCxxModuleConfigTargetInclusion
          (cmExportBuildFileGenerator *this,string *config)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  *this_00;
  reference ppcVar4;
  ostream *poVar5;
  string local_538;
  cmGeneratorTarget *local_518;
  cmGeneratorTarget *tgt;
  iterator __end1;
  iterator __begin1;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  *__range1;
  undefined1 local_4d8 [8];
  ostringstream e;
  string local_360 [8];
  string se;
  cmGeneratedFileStream os;
  cmAlphaNum local_a8;
  undefined1 local_78 [8];
  string fileName;
  undefined1 local_40 [8];
  string cxx_modules_dirname;
  string *config_local;
  cmExportBuildFileGenerator *this_local;
  
  cxx_modules_dirname.field_2._8_8_ = config;
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x15])(local_40);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::__cxx11::string::operator=((string *)config,"noconfig");
    }
    cmAlphaNum::cmAlphaNum(&local_a8,&(this->super_cmExportFileGenerator).FileDir);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&os.field_0x260,'/');
    cmStrCat<std::__cxx11::string,char[14],std::__cxx11::string,char[7]>
              ((string *)local_78,&local_a8,(cmAlphaNum *)&os.field_0x260,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [14])0xbef7f5,config,(char (*) [7])0xbc900d);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)((long)&se.field_2 + 8),(string *)local_78,true,None);
    bVar1 = std::ios::operator!((ios *)((long)&se.field_2 + *(long *)(se.field_2._8_8_ + -0x18) + 8)
                               );
    if ((bVar1 & 1) == 0) {
      cmGeneratedFileStream::SetCopyIfDifferent
                ((cmGeneratedFileStream *)((long)&se.field_2 + 8),true);
      this_00 = &(this->super_cmExportFileGenerator).ExportedTargets;
      __end1 = std::
               set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
               ::begin(this_00);
      tgt = (cmGeneratorTarget *)
            std::
            set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
            ::end(this_00);
      while (bVar2 = std::operator!=(&__end1,(_Self *)&tgt), bVar2) {
        ppcVar4 = std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator*(&__end1);
        local_518 = *ppcVar4;
        poVar5 = std::operator<<((ostream *)((long)&se.field_2 + 8),
                                 "include(\"${CMAKE_CURRENT_LIST_DIR}/target-");
        cmGeneratorTarget::GetExportName_abi_cxx11_(&local_538,local_518);
        poVar5 = std::operator<<(poVar5,(string *)&local_538);
        poVar5 = std::operator<<(poVar5,'-');
        poVar5 = std::operator<<(poVar5,(string *)config);
        std::operator<<(poVar5,".cmake\")\n");
        std::__cxx11::string::~string((string *)&local_538);
        std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator++(&__end1);
      }
      this_local._7_1_ = true;
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d8);
      poVar5 = std::operator<<((ostream *)local_4d8,"cannot write to file \"");
      poVar5 = std::operator<<(poVar5,(string *)local_78);
      poVar5 = std::operator<<(poVar5,"\": ");
      std::operator<<(poVar5,local_360);
      std::__cxx11::ostringstream::str();
      cmSystemTools::Error((string *)&__range1);
      std::__cxx11::string::~string((string *)&__range1);
      this_local._7_1_ = false;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d8);
      std::__cxx11::string::~string(local_360);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)((long)&se.field_2 + 8));
    std::__cxx11::string::~string((string *)local_78);
  }
  else {
    this_local._7_1_ = true;
  }
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool cmExportBuildFileGenerator::GenerateImportCxxModuleConfigTargetInclusion(
  std::string config) const
{
  auto cxx_modules_dirname = this->GetCxxModulesDirectory();
  if (cxx_modules_dirname.empty()) {
    return true;
  }

  if (config.empty()) {
    config = "noconfig";
  }

  std::string fileName = cmStrCat(this->FileDir, '/', cxx_modules_dirname,
                                  "/cxx-modules-", config, ".cmake");

  cmGeneratedFileStream os(fileName, true);
  if (!os) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  os.SetCopyIfDifferent(true);

  for (auto const* tgt : this->ExportedTargets) {
    os << "include(\"${CMAKE_CURRENT_LIST_DIR}/target-" << tgt->GetExportName()
       << '-' << config << ".cmake\")\n";
  }

  return true;
}